

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftedMieBondType.hpp
# Opt level: O1

void __thiscall OpenMD::ShiftedMieBondType::~ShiftedMieBondType(ShiftedMieBondType *this)

{
  operator_delete(this,0x40);
  return;
}

Assistant:

ShiftedMieBondType(RealType mySigma, RealType myEpsilon, int myNrep,
                       int myMatt) :
        BondType(0.0) {
      sigma   = mySigma;
      epsilon = myEpsilon;
      n       = myNrep;
      m       = myMatt;

      rS_ = exp(log(pow(sigma, m - n) * RealType(m) / n));

      nmScale_ = n * pow(RealType(n) / m, RealType(m) / (n - m)) / (n - m);

      RealType rss = rS_ / sigma;
      RealType rsi = 1.0 / rss;
      RealType rsn = pow(rsi, n);
      RealType rsm = pow(rsi, m);

      potS_ = nmScale_ * epsilon * (rsn - rsm);

      setEquilibriumBondLength(rS_);
    }